

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTSupport.h
# Opt level: O3

int32 __thiscall TTD::MarkTable::FindIndexForKey(MarkTable *this,uint64 addr)

{
  uint64 *puVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  
  puVar1 = this->m_addrArray;
  if (puVar1 == (uint64 *)0x0) {
    TTDAbort_unrecoverable_error("Not valid!!");
  }
  uVar4 = this->m_capcity - 1;
  uVar3 = (uint)addr & uVar4;
  if (puVar1[uVar3] != 0 && puVar1[uVar3] != addr) {
    uVar2 = uVar3 + (int)(addr % (ulong)this->m_h2Prime) & uVar4;
    uVar3 = uVar2;
    while ((puVar1[uVar3] != addr && (puVar1[uVar3] != 0))) {
      uVar3 = uVar3 + 1 & uVar4;
      if (uVar3 == uVar2) {
        TTDAbort_unrecoverable_error("We messed up.");
      }
    }
  }
  return uVar3;
}

Assistant:

int32 FindIndexForKey(uint64 addr) const
        {
            TTDAssert(this->m_addrArray != nullptr, "Not valid!!");

            uint32 primaryMask = this->m_capcity - 1;

            uint32 primaryIndex = TTD_MARK_TABLE_HASH1(addr, this->m_capcity);
            uint64 primaryAddr = this->m_addrArray[primaryIndex];
            if ((primaryAddr == addr) | (primaryAddr == 0))
            {
                return (int32)primaryIndex;
            }

            //do a hash for the second offset to avoid clustering and then do linear probing
            uint32 offset = TTD_MARK_TABLE_HASH2(addr, this->m_h2Prime);
            uint32 probeIndex = TTD_MARK_TABLE_INDEX(primaryIndex + offset, this->m_capcity);
            while (true)
            {
                uint64 currAddr = this->m_addrArray[probeIndex];
                if ((currAddr == addr) | (currAddr == 0))
                {
                    return (int32)probeIndex;
                }
                probeIndex = TTD_MARK_TABLE_INDEX(probeIndex + 1, this->m_capcity);

                TTDAssert(probeIndex != ((primaryIndex + offset) & primaryMask), "We messed up.");
            }
        }